

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O0

void __thiscall Constant::jumping(Constant *this,int t,int f)

{
  element_type *peVar1;
  ostream *poVar2;
  string local_1f0;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  int local_18;
  int local_14;
  int f_local;
  int t_local;
  Constant *this_local;
  
  local_18 = f;
  local_14 = t;
  _f_local = this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  peVar1 = std::__shared_ptr<Constant,_(__gnu_cxx::_Lock_policy)2>::get
                     (&True.super___shared_ptr<Constant,_(__gnu_cxx::_Lock_policy)2>);
  if ((this == peVar1) && (local_14 != 0)) {
    poVar2 = std::operator<<(local_190,"goto L");
    std::ostream::operator<<(poVar2,local_14);
    std::__cxx11::stringstream::str();
    Node::emit((Node *)this,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
  }
  else {
    peVar1 = std::__shared_ptr<Constant,_(__gnu_cxx::_Lock_policy)2>::get
                       (&False.super___shared_ptr<Constant,_(__gnu_cxx::_Lock_policy)2>);
    if ((this == peVar1) && (local_18 != 0)) {
      poVar2 = std::operator<<(local_190,"goto L");
      std::ostream::operator<<(poVar2,local_18);
      std::__cxx11::stringstream::str();
      Node::emit((Node *)this,&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
    }
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void jumping(int t, int f) override {
		std::stringstream ss;
		if (this == True.get() && t != 0) {
			ss << "goto L" << t;
			emit(ss.str());
		}
		else if (this == False.get() && f != 0) {
			ss << "goto L" << f;
			emit(ss.str());
		}
	}